

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_ffrecord.c
# Opt level: O2

TRef recff_io_fp(jit_State *J,TRef *udp,int32_t id)

{
  TRef TVar1;
  uint uVar2;
  TRef TVar3;
  
  if (id == 0) {
    uVar2 = *J->base;
    if ((uVar2 & 0x1f000000) != 0xc000000) {
      lj_trace_err(J,LJ_TRERR_BADTYPE);
    }
    (J->fold).ins.field_0.op1 = (IRRef1)uVar2;
    *(undefined4 *)((long)&(J->fold).ins.field_1.op12 + 2) = 0x4310000a;
    TVar1 = lj_opt_fold(J);
    TVar3 = lj_ir_kint(J,1);
    (J->fold).ins.field_0.ot = 0x893;
    (J->fold).ins.field_0.op1 = (IRRef1)TVar1;
    (J->fold).ins.field_0.op2 = (IRRef1)TVar3;
    lj_opt_fold(J);
  }
  else {
    TVar1 = lj_ir_kptr_(J,IR_KPTR,(void *)((long)J + (long)id * 4 + -0x98));
    (J->fold).ins.field_0.op1 = (IRRef1)TVar1;
    *(undefined4 *)((long)&(J->fold).ins.field_1.op12 + 2) = 0x440c0000;
    uVar2 = lj_opt_fold(J);
  }
  *udp = uVar2;
  (J->fold).ins.field_0.op1 = (IRRef1)uVar2;
  *(undefined4 *)((long)&(J->fold).ins.field_1.op12 + 2) = 0x4309000b;
  TVar1 = lj_opt_fold(J);
  TVar3 = lj_ir_knull(J,IRT_P64);
  (J->fold).ins.field_0.ot = 0x989;
  (J->fold).ins.field_0.op1 = (IRRef1)TVar1;
  (J->fold).ins.field_0.op2 = (IRRef1)TVar3;
  lj_opt_fold(J);
  return TVar1;
}

Assistant:

static TRef recff_io_fp(jit_State *J, TRef *udp, int32_t id)
{
  TRef tr, ud, fp;
  if (id) {  /* io.func() */
    tr = lj_ir_kptr(J, &J2G(J)->gcroot[id]);
    ud = emitir(IRT(IR_XLOAD, IRT_UDATA), tr, 0);
  } else {  /* fp:method() */
    ud = J->base[0];
    if (!tref_isudata(ud))
      lj_trace_err(J, LJ_TRERR_BADTYPE);
    tr = emitir(IRT(IR_FLOAD, IRT_U8), ud, IRFL_UDATA_UDTYPE);
    emitir(IRTGI(IR_EQ), tr, lj_ir_kint(J, UDTYPE_IO_FILE));
  }
  *udp = ud;
  fp = emitir(IRT(IR_FLOAD, IRT_PTR), ud, IRFL_UDATA_FILE);
  emitir(IRTG(IR_NE, IRT_PTR), fp, lj_ir_knull(J, IRT_PTR));
  return fp;
}